

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O1

int __thiscall QAccessibleTableCell::columnIndex(QAccessibleTableCell *this)

{
  char cVar1;
  int iVar2;
  int iVar3;
  
  cVar1 = (**(code **)(*(long *)this + 0x10))();
  iVar3 = -1;
  if (cVar1 != '\0') {
    iVar2 = (**(code **)(*(long *)this + 0x78))(this);
    iVar3 = 0;
    if (iVar2 != 0x22) {
      iVar3 = QPersistentModelIndex::column();
      return iVar3;
    }
  }
  return iVar3;
}

Assistant:

int QAccessibleTableCell::columnIndex() const
{
    if (!isValid())
        return -1;
#if QT_CONFIG(listview)
    if (role() == QAccessible::ListItem) {
        return 0;
    }
#endif
    return m_index.column();
}